

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O0

char * sprintf_alloc(char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  char *local_38;
  char *retval;
  size_t len;
  va_list ap;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_e8;
  ap[0]._0_8_ = &stack0x00000008;
  len._4_4_ = 0x30;
  len._0_4_ = 8;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  ap[0].reg_save_area = fmt;
  iVar1 = vsnprintf((char *)0x0,0,fmt,&len);
  retval = (char *)(long)iVar1;
  local_38 = (char *)get_ioblob((size_t)(retval + 1));
  ap[0].overflow_arg_area = local_e8;
  ap[0]._0_8_ = &stack0x00000008;
  len._4_4_ = 0x30;
  len._0_4_ = 8;
  iVar1 = vsnprintf(local_38,(size_t)(retval + 1),(char *)ap[0].reg_save_area,&len);
  if ((char *)(long)iVar1 != retval) {
    local_38 = (char *)0x0;
  }
  return local_38;
}

Assistant:

char *sprintf_alloc(const char *fmt, ...)
{
    va_list ap;
    va_start(ap, fmt);
    const size_t len = vsnprintf(NULL, 0, fmt, ap);
    va_end(ap);

    char *retval = (char *) get_ioblob(len + 1);
    va_start(ap, fmt);
    if (vsnprintf(retval, len + 1, fmt, ap) != len) {
        retval = NULL;
    }
    va_end(ap);

    return retval;
}